

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  short *psVar1;
  ImWchar *__dest;
  float fVar2;
  uchar uVar3;
  short sVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  int iVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  unsigned_short *puVar10;
  float fVar11;
  StbUndoRecord *pSVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  float fVar28;
  StbTexteditRow row;
  ImWchar ch;
  undefined2 uStack_46;
  uint local_3c;
  int local_38;
  uint local_34;
  
  state = &this->Stb;
  uVar3 = (this->Stb).single_line;
  iVar14 = 1;
LAB_001edc1f:
  switch(key) {
  case 0x200000:
    goto switchD_001edc31_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    ImStb::stb_textedit_clamp(this,state);
    goto LAB_001ee676;
  case 0x200002:
  case 0x20000e:
switchD_001edc31_caseD_200002:
    uVar26 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000e) {
      iVar14 = (this->Stb).row_count_per_page;
    }
    else if (uVar3 != '\0') {
      key = uVar26 | 0x200000;
      goto LAB_001edc1f;
    }
    if (uVar26 == 0) {
      if ((this->Stb).select_start != (this->Stb).select_end) {
        ImStb::stb_textedit_move_to_first(state);
      }
    }
    else {
      ImStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_find_charpos
              ((StbFindState *)&ch,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    iVar20 = 0;
    goto LAB_001edd2d;
  case 0x200003:
  case 0x20000f:
switchD_001edc31_caseD_200003:
    uVar26 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000f) {
      iVar14 = (this->Stb).row_count_per_page;
LAB_001edcb7:
      if (uVar26 == 0) {
        if ((this->Stb).select_start != (this->Stb).select_end) {
          ImStb::stb_textedit_move_to_last(this,state);
        }
      }
      else {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_find_charpos
                ((StbFindState *)&ch,this,(this->Stb).cursor,(uint)(this->Stb).single_line);
      iVar20 = 0;
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      goto LAB_001ede93;
    }
    if (uVar3 == '\0') goto LAB_001edcb7;
    key = uVar26 | 0x200001;
    goto LAB_001edc1f;
  case 0x200004:
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar14 = (this->Stb).cursor;
      puVar10 = (this->TextW).Data;
      while ((0 < iVar14 && (puVar10[iVar14 - 1] != 10))) {
        iVar14 = iVar14 + -1;
        state->cursor = iVar14;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_001ee676;
  case 0x200005:
    iVar14 = this->CurLenW;
    ImStb::stb_textedit_clamp(this,state);
    ImStb::stb_textedit_move_to_first(state);
    if ((this->Stb).single_line == '\0') {
      iVar20 = (this->Stb).cursor;
      puVar10 = (this->TextW).Data;
      for (lVar17 = (long)iVar20; (iVar20 = iVar20 + 1, lVar17 < iVar14 && (puVar10[lVar17] != 10));
          lVar17 = lVar17 + 1) {
        state->cursor = iVar20;
      }
    }
    else {
      state->cursor = iVar14;
    }
    goto LAB_001ee676;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_001ee676;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_001ee676;
  case 0x200008:
switchD_001edc31_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = (this->Stb).cursor;
      if (iVar14 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_001ee676;
    }
    break;
  case 0x200009:
switchD_001edc31_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      ImStb::stb_textedit_clamp(this,state);
      iVar14 = (this->Stb).cursor;
      if (0 < iVar14) {
        ImStb::stb_textedit_delete(this,state,iVar14 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_001ee676;
    }
    break;
  case 0x20000a:
    lVar17 = (long)(this->Stb).undostate.undo_point;
    if (lVar17 != 0) {
      iVar14 = (this->Stb).undostate.undo_rec[lVar17 + -1].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length;
      uVar26 = (this->Stb).undostate.undo_rec[lVar17 + -1].delete_length;
      iVar24 = (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage;
      lVar17 = (long)(this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_rec[lVar17 + -1].char_storage = -1;
      (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length = uVar26;
      (this->Stb).undostate.undo_rec[lVar17 + -1].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[lVar17 + -1].where = iVar14;
      if (uVar26 != 0) {
        iVar27 = (this->Stb).undostate.undo_char_point;
        if ((int)(iVar27 + uVar26) < 999) {
          do {
            iVar25 = (this->Stb).undostate.redo_char_point;
            sVar4 = (this->Stb).undostate.redo_point;
            lVar17 = (long)sVar4;
            do {
              if ((int)(iVar27 + uVar26) <= iVar25) {
                piVar18 = &(this->Stb).undostate.undo_rec[lVar17 + -1].char_storage;
                *piVar18 = iVar25 - uVar26;
                (this->Stb).undostate.redo_char_point = iVar25 - uVar26;
                uVar19 = 0;
                uVar22 = 0;
                if (0 < (int)uVar26) {
                  uVar22 = (ulong)uVar26;
                }
                for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
                  (this->Stb).undostate.undo_char[(long)*piVar18 + uVar19] =
                       (this->TextW).Data[(long)iVar14 + uVar19];
                }
                goto LAB_001ee239;
              }
              if (sVar4 == 99) goto LAB_001ee676;
            } while (0x62 < sVar4);
            if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
              iVar27 = (this->Stb).undostate.undo_rec[0x62].insert_length;
              iVar25 = iVar25 + iVar27;
              (this->Stb).undostate.redo_char_point = iVar25;
              __dest = (this->Stb).undostate.undo_char + iVar25;
              memmove(__dest,__dest + -(long)iVar27,(long)(999 - iVar25) * 2);
              lVar17 = (long)(this->Stb).undostate.redo_point;
              piVar18 = &(this->Stb).undostate.undo_rec[lVar17].char_storage;
              for (lVar21 = lVar17; lVar21 < 0x62; lVar21 = lVar21 + 1) {
                if (-1 < *piVar18) {
                  *piVar18 = *piVar18 + iVar27;
                }
                piVar18 = piVar18 + 4;
              }
            }
            memmove((this->Stb).undostate.undo_rec + lVar17 + 1,
                    (this->Stb).undostate.undo_rec + lVar17,lVar17 * -0x10 + 0x620);
            psVar1 = &(this->Stb).undostate.redo_point;
            *psVar1 = *psVar1 + 1;
            iVar27 = (this->Stb).undostate.undo_char_point;
          } while( true );
        }
        (this->Stb).undostate.undo_rec[lVar17 + -1].insert_length = 0;
LAB_001ee239:
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar26);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar24,iVar20)
        ;
        piVar18 = &(this->Stb).undostate.undo_char_point;
        *piVar18 = *piVar18 - iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar14;
      uVar5 = (this->Stb).undostate.undo_point;
      uVar8 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar5 + -1;
      (this->Stb).undostate.redo_point = uVar8 + -1;
    }
    goto LAB_001ee676;
  case 0x20000b:
    lVar17 = (long)(this->Stb).undostate.redo_point;
    if (lVar17 != 99) {
      sVar4 = (this->Stb).undostate.undo_point;
      iVar14 = (this->Stb).undostate.undo_rec[lVar17].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar17].insert_length;
      iVar24 = (this->Stb).undostate.undo_rec[lVar17].delete_length;
      iVar27 = (this->Stb).undostate.undo_rec[lVar17].char_storage;
      (this->Stb).undostate.undo_rec[sVar4].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[sVar4].insert_length = iVar24;
      (this->Stb).undostate.undo_rec[sVar4].where = iVar14;
      (this->Stb).undostate.undo_rec[sVar4].char_storage = -1;
      if (iVar24 != 0) {
        iVar7 = (this->Stb).undostate.undo_char_point;
        iVar25 = iVar7 + iVar24;
        if ((this->Stb).undostate.redo_char_point < iVar25) {
          pSVar12 = (this->Stb).undostate.undo_rec + sVar4;
          pSVar12->insert_length = 0;
          pSVar12->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar4].char_storage = iVar7;
          (this->Stb).undostate.undo_char_point = iVar25;
          for (lVar17 = 0; (int)lVar17 < (this->Stb).undostate.undo_rec[sVar4].insert_length;
              lVar17 = lVar17 + 1) {
            (this->Stb).undostate.undo_char
            [(this->Stb).undostate.undo_rec[sVar4].char_storage + lVar17] =
                 (this->TextW).Data[(this->Stb).undostate.undo_rec[sVar4].where + lVar17];
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,iVar24);
      }
      if (iVar20 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar20)
        ;
        piVar18 = &(this->Stb).undostate.redo_char_point;
        *piVar18 = *piVar18 + iVar20;
      }
      (this->Stb).cursor = iVar20 + iVar14;
      uVar6 = (this->Stb).undostate.undo_point;
      uVar9 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar6 + 1;
      (this->Stb).undostate.redo_point = uVar9 + 1;
    }
    goto LAB_001ee676;
  case 0x20000c:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_001ee398;
    }
    ImStb::stb_textedit_move_to_first(state);
    goto LAB_001ee67b;
  case 0x20000d:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_001ee398:
      (this->Stb).cursor = iVar14;
LAB_001ee39c:
      ImStb::stb_textedit_clamp(this,state);
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_001ee67b;
  default:
    switch(key) {
    case 0x600000:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar14 = (this->Stb).select_end;
      if (0 < iVar14) {
        iVar14 = iVar14 + -1;
        goto LAB_001ee108;
      }
      break;
    case 0x600001:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      piVar18 = &(this->Stb).select_end;
      *piVar18 = *piVar18 + 1;
      ImStb::stb_textedit_clamp(this,state);
      iVar14 = (this->Stb).select_end;
      break;
    case 0x600002:
    case 0x60000e:
      goto switchD_001edc31_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_001edc31_caseD_200003;
    case 0x600004:
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        uVar23 = (this->Stb).cursor;
        puVar10 = (this->TextW).Data;
        uVar15 = (int)uVar23 >> 0x1f & uVar23;
        while ((uVar26 = uVar15, 0 < (int)uVar23 && (uVar26 = uVar23, puVar10[uVar23 - 1] != 10))) {
          uVar23 = uVar23 - 1;
          state->cursor = uVar23;
        }
      }
      else {
        state->cursor = 0;
        uVar26 = 0;
      }
      (this->Stb).select_end = uVar26;
      goto LAB_001ee676;
    case 0x600005:
      iVar14 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->Stb).single_line == '\0') {
        iVar20 = (this->Stb).cursor;
        lVar17 = (long)iVar20;
        puVar10 = (this->TextW).Data;
        iVar24 = iVar14;
        if (iVar14 < iVar20) {
          iVar24 = iVar20;
        }
        for (; (iVar20 = iVar24, lVar17 < iVar14 && (iVar20 = (int)lVar17, puVar10[lVar17] != 10));
            lVar17 = lVar17 + 1) {
          state->cursor = iVar20 + 1;
        }
      }
      else {
        state->cursor = iVar14;
        iVar20 = iVar14;
      }
      (this->Stb).select_end = iVar20;
      goto LAB_001ee676;
    case 0x600006:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      goto LAB_001ee676;
    case 0x600007:
      ImStb::stb_textedit_prep_selection_at_cursor(state);
      iVar14 = this->CurLenW;
LAB_001ee108:
      (this->Stb).select_end = iVar14;
      break;
    case 0x600008:
      goto switchD_001edc31_caseD_200008;
    case 0x600009:
      goto switchD_001edc31_caseD_200009;
    default:
      uVar26 = 0;
      if (key < 0x200000) {
        uVar26 = key;
      }
      if ((int)uVar26 < 1) goto LAB_001ee67b;
      _ch = (float)CONCAT22(uStack_46,(short)uVar26);
      if (uVar26 == 10 && uVar3 != '\0') goto LAB_001ee67b;
      if ((((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end)
          ) || (iVar14 = (this->Stb).cursor, this->CurLenW <= iVar14)) {
        ImStb::stb_textedit_delete_selection(this,state);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,&ch,1);
        if (!bVar13) goto LAB_001ee67b;
        ImStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        ImStb::stb_text_makeundo_replace(this,state,iVar14,1,1);
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,&ch,1);
        if (!bVar13) goto LAB_001ee67b;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_001ee676;
    case 0x60000c:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar14 = ImStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->Stb).cursor);
      goto LAB_001ee09c;
    case 0x60000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar14 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
LAB_001ee09c:
      (this->Stb).cursor = iVar14;
      (this->Stb).select_end = iVar14;
      goto LAB_001ee39c;
    }
    (this->Stb).cursor = iVar14;
    goto LAB_001ee676;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_001ee676;
LAB_001ede93:
  if (iVar20 == iVar14) goto LAB_001ee67b;
  fVar2 = _ch;
  if ((this->Stb).has_preferred_x != '\0') {
    fVar2 = (this->Stb).preferred_x;
  }
  if ((local_38 == 0) ||
     (uVar23 = local_3c + local_38, (this->TextW).Data[(long)(int)uVar23 + -1] != 10))
  goto LAB_001ee67b;
  (this->Stb).cursor = uVar23;
  ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,uVar23);
  iVar24 = row.num_chars;
  iVar25 = 0;
  iVar27 = 0;
  if (0 < row.num_chars) {
    iVar27 = row.num_chars;
  }
  iVar7 = (this->Stb).cursor;
  fVar11 = row.x0;
  for (; iVar27 != iVar25; iVar25 = iVar25 + 1) {
    fVar28 = ImStb::STB_TEXTEDIT_GETWIDTH(this,uVar23,iVar25);
    if (((fVar28 == -1.0) && (!NAN(fVar28))) || (fVar11 = fVar11 + fVar28, fVar2 < fVar11)) break;
    state->cursor = iVar7 + 1 + iVar25;
  }
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar2;
  if (uVar26 != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  iVar20 = iVar20 + 1;
  local_3c = uVar23;
  local_38 = iVar24;
  goto LAB_001ede93;
LAB_001edd2d:
  uVar23 = local_34;
  if (iVar20 == iVar14) goto LAB_001ee67b;
  fVar2 = _ch;
  if ((this->Stb).has_preferred_x != '\0') {
    fVar2 = (this->Stb).preferred_x;
  }
  if (uVar23 == local_3c) goto LAB_001ee67b;
  (this->Stb).cursor = uVar23;
  ImStb::STB_TEXTEDIT_LAYOUTROW(&row,this,uVar23);
  iVar27 = 0;
  iVar24 = row.num_chars;
  if (row.num_chars < 1) {
    iVar24 = 0;
  }
  iVar25 = (this->Stb).cursor;
  fVar11 = row.x0;
  for (; iVar24 != iVar27; iVar27 = iVar27 + 1) {
    fVar28 = ImStb::STB_TEXTEDIT_GETWIDTH(this,uVar23,iVar27);
    if (((fVar28 == -1.0) && (!NAN(fVar28))) || (fVar11 = fVar11 + fVar28, fVar2 < fVar11)) break;
    state->cursor = iVar25 + 1 + iVar27;
  }
  ImStb::stb_textedit_clamp(this,state);
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar2;
  if (uVar26 != 0) {
    (this->Stb).select_end = (this->Stb).cursor;
  }
  uVar19 = (ulong)(uVar23 - 1);
  if ((int)uVar23 < 1) {
    uVar19 = 0;
  }
  uVar15 = (uint)uVar19;
  uVar16 = uVar15 + 1;
  do {
    local_34 = (int)uVar15 >> 0x1f & uVar15;
    if ((int)uVar19 < 1) break;
    uVar16 = uVar16 - 1;
    lVar17 = uVar19 - 1;
    uVar19 = uVar19 - 1;
    local_34 = uVar16;
  } while ((this->TextW).Data[lVar17] != 10);
  iVar20 = iVar20 + 1;
  local_3c = uVar23;
  goto LAB_001edd2d;
switchD_001edc31_caseD_200000:
  if ((this->Stb).select_start == (this->Stb).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImStb::stb_textedit_move_to_first(state);
  }
LAB_001ee676:
  (this->Stb).has_preferred_x = '\0';
LAB_001ee67b:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}